

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_s16(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  drwav_uint64 dVar6;
  drwav_uint64 dVar7;
  uint uVar8;
  drwav_int32 *pdVar9;
  ulong uVar10;
  int iVar11;
  drwav_uint64 dVar12;
  drwav_uint64 unaff_RBP;
  drwav_uint32 *pdVar13;
  drwav_uint64 dVar14;
  long lVar15;
  drwav_int32 dVar16;
  uint uVar17;
  drwav_uint64 dVar18;
  int iVar19;
  bool bVar20;
  byte abStack_78 [4];
  byte bStack_74;
  byte bStack_73;
  byte bStack_72;
  drwav_uint32 *pdStack_70;
  drwav_int16 *pdStack_68;
  drwav_uint32 *pdStack_60;
  long lStack_58;
  drwav_uint64 dStack_50;
  drwav_uint64 dStack_48;
  drwav_int32 *pdStack_40;
  drwav_uint64 dStack_38;
  
  if (pBufferOut != (drwav_int16 *)0x0 && (samplesToRead != 0 && pWav != (drwav *)0x0)) {
    switch(pWav->translatedFormatTag) {
    case 1:
      dVar18 = drwav_read_s16__pcm(pWav,samplesToRead,pBufferOut);
      return dVar18;
    case 2:
      dVar18 = drwav_read_s16__msadpcm(pWav,samplesToRead,pBufferOut);
      return dVar18;
    case 3:
      dVar18 = drwav_read_s16__ieee(pWav,samplesToRead,pBufferOut);
      return dVar18;
    case 4:
    case 5:
      break;
    case 6:
      dVar18 = drwav_read_s16__alaw(pWav,samplesToRead,pBufferOut);
      return dVar18;
    case 7:
      dVar18 = drwav_read_s16__mulaw(pWav,samplesToRead,pBufferOut);
      return dVar18;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        if (samplesToRead == 0) {
          dVar18 = 0;
        }
        else {
          pdStack_70 = &(pWav->ima).cachedSampleCount;
          pdStack_40 = (pWav->ima).cachedSamples;
          dVar12 = 0;
          do {
            if (pWav->totalSampleCount <= (pWav->compressed).iCurrentSample) {
              return dVar12;
            }
            dVar7 = unaff_RBP;
            if ((*pdStack_70 == 0) && ((pWav->ima).bytesRemainingInBlock == 0)) {
              dVar7 = dVar12;
              if (pWav->channels == 1) {
                sVar5 = (*pWav->onRead)(pWav->pUserData,abStack_78,4);
                if (sVar5 == 4) {
                  (pWav->ima).bytesRemainingInBlock = (pWav->fmt).blockAlign - 4;
                  uVar8 = (int)(short)((ushort)abStack_78[1] << 8) | (uint)abStack_78[0];
                  (pWav->ima).predictor[0] = uVar8;
                  (pWav->ima).stepIndex[0] = (uint)abStack_78[2];
                  (pWav->ima).cachedSamples[0xf] = uVar8;
                  (pWav->ima).cachedSampleCount = 1;
                  dVar7 = unaff_RBP;
                }
                bVar20 = sVar5 == 4;
              }
              else {
                sVar5 = (*pWav->onRead)(pWav->pUserData,abStack_78,8);
                if (sVar5 == 8) {
                  (pWav->ima).bytesRemainingInBlock = (pWav->fmt).blockAlign - 8;
                  uVar8 = (int)(short)((ushort)abStack_78[1] << 8) | (uint)abStack_78[0];
                  (pWav->ima).predictor[0] = uVar8;
                  (pWav->ima).stepIndex[0] = (uint)abStack_78[2];
                  uVar17 = (int)(short)((ushort)bStack_73 << 8) | (uint)bStack_74;
                  (pWav->ima).predictor[1] = uVar17;
                  (pWav->ima).stepIndex[1] = (uint)bStack_72;
                  (pWav->ima).cachedSamples[0xe] = uVar8;
                  (pWav->ima).cachedSamples[0xf] = uVar17;
                  (pWav->ima).cachedSampleCount = 2;
                  dVar7 = unaff_RBP;
                }
                bVar20 = sVar5 == 8;
              }
              if (!bVar20) {
                return dVar7;
              }
            }
            uVar8 = *pdStack_70;
            uVar10 = (ulong)uVar8;
            dVar6 = samplesToRead - uVar10;
            dVar18 = dVar12 + uVar10;
            dVar14 = 0;
            pdStack_68 = pBufferOut;
            while (uVar8 = uVar8 - 1, dVar14 != uVar10) {
              uVar4 = (pWav->compressed).iCurrentSample;
              if (pWav->totalSampleCount <= uVar4) {
                dVar6 = samplesToRead - dVar14;
                dVar18 = dVar12 + dVar14;
                if (dVar14 != uVar10) goto LAB_0010b683;
                break;
              }
              pBufferOut[dVar14] = (drwav_int16)pdStack_70[dVar14 - uVar10];
              (pWav->ima).cachedSampleCount = uVar8;
              pdStack_68 = pdStack_68 + 1;
              (pWav->compressed).iCurrentSample = uVar4 + 1;
              dVar14 = dVar14 + 1;
              if (samplesToRead == dVar14) {
                return samplesToRead + dVar12;
              }
            }
            if ((pWav->ima).bytesRemainingInBlock != 0) {
              uVar2 = pWav->channels;
              (pWav->ima).cachedSampleCount = (uint)uVar2 * 8;
              bVar20 = uVar2 != 0;
              dStack_50 = dVar6;
              if (bVar20) {
                lStack_58 = 0x10;
                pdStack_60 = pdStack_70;
                uVar10 = 0;
                dVar12 = dVar7;
                dStack_48 = dVar18;
                do {
                  sVar5 = (*pWav->onRead)(pWav->pUserData,abStack_78,4);
                  dVar7 = dVar18;
                  if (sVar5 == 4) {
                    (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
                    uVar2 = pWav->channels;
                    pdVar9 = pdStack_40 + lStack_58 + (ulong)uVar2;
                    lVar15 = 0;
                    pdVar13 = pdStack_60;
                    do {
                      bVar1 = abStack_78[lVar15];
                      uVar17 = bVar1 & 0xf;
                      iVar3 = (pWav->ima).stepIndex[uVar10];
                      uVar8 = drwav_read_s16__ima::stepTable[iVar3];
                      iVar19 = ((int)(uVar17 << 0x1d) >> 0x1f & uVar8) +
                               ((int)uVar8 >> 1 & (int)(uVar17 << 0x1e) >> 0x1f) +
                               ((int)uVar8 >> 2 & -(bVar1 & 1)) + ((int)uVar8 >> 3);
                      iVar11 = -iVar19;
                      if ((byte)uVar17 < 8) {
                        iVar11 = iVar19;
                      }
                      uVar8 = iVar11 + (pWav->ima).predictor[uVar10];
                      if (0x7ffe < (int)uVar8) {
                        uVar8 = 0x7fff;
                      }
                      if ((int)uVar8 < -0x7fff) {
                        uVar8 = 0xffff8000;
                      }
                      (pWav->ima).predictor[uVar10] = uVar8;
                      dVar16 = iVar3 + drwav_read_s16__ima::indexTable[uVar17];
                      if (0x57 < dVar16) {
                        dVar16 = 0x58;
                      }
                      if (dVar16 < 1) {
                        dVar16 = 0;
                      }
                      (pWav->ima).stepIndex[uVar10] = dVar16;
                      pdVar13[-(ulong)(pWav->ima).cachedSampleCount] = uVar8;
                      iVar3 = (pWav->ima).stepIndex[uVar10];
                      uVar8 = drwav_read_s16__ima::stepTable[iVar3];
                      iVar19 = ((int)((uint)bVar1 << 0x19) >> 0x1f & uVar8) + ((int)uVar8 >> 3) +
                               ((int)uVar8 >> 2 & -(uint)((bVar1 >> 4 & 1) != 0)) +
                               ((int)uVar8 >> 1 & (int)((uint)bVar1 << 0x1a) >> 0x1f);
                      iVar11 = -iVar19;
                      if (-1 < (char)bVar1) {
                        iVar11 = iVar19;
                      }
                      iVar11 = iVar11 + (pWav->ima).predictor[uVar10];
                      if (0x7ffe < iVar11) {
                        iVar11 = 0x7fff;
                      }
                      if (iVar11 < -0x7fff) {
                        iVar11 = -0x8000;
                      }
                      (pWav->ima).predictor[uVar10] = iVar11;
                      dVar16 = iVar3 + drwav_read_s16__ima::indexTable[bVar1 >> 4];
                      if (0x57 < dVar16) {
                        dVar16 = 0x58;
                      }
                      if (dVar16 < 1) {
                        dVar16 = 0;
                      }
                      (pWav->ima).stepIndex[uVar10] = dVar16;
                      pdVar9[-(ulong)(pWav->ima).cachedSampleCount] = iVar11;
                      lVar15 = lVar15 + 1;
                      pdVar9 = pdVar9 + (ulong)uVar2 * 2;
                      pdVar13 = pdVar13 + (ulong)uVar2 * 2;
                      dVar7 = dVar12;
                      dVar18 = dStack_48;
                      dStack_38 = dVar12;
                    } while (lVar15 != 4);
                  }
                  if (sVar5 != 4) break;
                  uVar10 = uVar10 + 1;
                  lStack_58 = lStack_58 + 1;
                  pdStack_60 = pdStack_60 + 1;
                  bVar20 = uVar10 < pWav->channels;
                  dVar12 = dVar7;
                } while (bVar20);
              }
              dVar6 = dStack_50;
              if (bVar20) {
                return dVar7;
              }
            }
LAB_0010b683:
            pBufferOut = pdStack_68;
            unaff_RBP = dVar7;
            samplesToRead = dVar6;
            dVar12 = dVar18;
          } while (dVar6 != 0);
        }
        return dVar18;
      }
    }
  }
  return 0;
}

Assistant:

drwav_uint64 drwav_read_s16(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut)
{
    if (pWav == NULL || samplesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (samplesToRead * sizeof(drwav_int16) > DRWAV_SIZE_MAX) {
        samplesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int16);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_s16__pcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_s16__msadpcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_s16__ieee(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_s16__alaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_s16__mulaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_s16__ima(pWav, samplesToRead, pBufferOut);
    }

    return 0;
}